

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O2

unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> __thiscall
duckdb::StorageLockInternals::TryGetExclusiveLock(StorageLockInternals *this)

{
  bool bVar1;
  long in_RSI;
  StorageLockType local_2c;
  enable_shared_from_this<duckdb::StorageLockInternals> local_28;
  
  bVar1 = ::std::mutex::try_lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x10))->__data);
  if (bVar1) {
    if (*(long *)(in_RSI + 0x38) == 0) {
      enable_shared_from_this<duckdb::StorageLockInternals>::shared_from_this(&local_28);
      local_2c = EXCLUSIVE;
      make_uniq<duckdb::StorageLockKey,duckdb::shared_ptr<duckdb::StorageLockInternals,true>,duckdb::StorageLockType>
                ((duckdb *)this,(shared_ptr<duckdb::StorageLockInternals,_true> *)&local_28,
                 &local_2c);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_28.__weak_this_.internal.
                  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
             (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x10));
  }
  (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
}

Assistant:

unique_ptr<StorageLockKey> TryGetExclusiveLock() {
		if (!exclusive_lock.try_lock()) {
			// could not lock mutex
			return nullptr;
		}
		if (read_count != 0) {
			// there are active readers - cannot get exclusive lock
			exclusive_lock.unlock();
			return nullptr;
		}
		// success!
		return make_uniq<StorageLockKey>(shared_from_this(), StorageLockType::EXCLUSIVE);
	}